

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base32.cpp
# Opt level: O0

bool ON_Base32ToString(uchar *base32_digits,int base32_digit_count,char *sBase32)

{
  bool local_33;
  bool rc;
  uchar d;
  char error_symbol;
  char *base32_digit_symbol;
  char *sBase32_local;
  byte *pbStack_18;
  int base32_digit_count_local;
  uchar *base32_digits_local;
  
  local_33 = false;
  if (sBase32 == (char *)0x0) {
    base32_digits_local._7_1_ = false;
  }
  else {
    if ((base32_digits == (uchar *)0x0) || (base32_digit_count < 1)) {
      base32_digit_symbol = sBase32 + 1;
      *sBase32 = '#';
    }
    else {
      local_33 = true;
      base32_digit_symbol = sBase32;
      sBase32_local._4_4_ = base32_digit_count;
      pbStack_18 = base32_digits;
      while (sBase32_local._4_4_ != 0) {
        if (*pbStack_18 < 0x20) {
          *base32_digit_symbol = "0123456789ABCDEFGHJKMNPQRTUVWXYZ"[*pbStack_18];
        }
        else {
          local_33 = false;
          *base32_digit_symbol = '#';
        }
        base32_digit_symbol = base32_digit_symbol + 1;
        sBase32_local._4_4_ = sBase32_local._4_4_ + -1;
        pbStack_18 = pbStack_18 + 1;
      }
    }
    *base32_digit_symbol = '\0';
    base32_digits_local._7_1_ = local_33;
  }
  return base32_digits_local._7_1_;
}

Assistant:

bool ON_Base32ToString( const unsigned char* base32_digits, int base32_digit_count, char* sBase32 )
{
  const char* base32_digit_symbol = "0123456789ABCDEFGHJKMNPQRTUVWXYZ";
  const char error_symbol = '#';
  unsigned char d;
  bool rc = false;

  if ( 0 == sBase32 )
    return false;

  if ( 0 == base32_digits || base32_digit_count <= 0 )
  {
    *sBase32++ = error_symbol;
  }
  else
  {
    rc = true;
    while(base32_digit_count--)
    {
      d = *base32_digits++;
      if ( d < 32 )
      {
        *sBase32++ = base32_digit_symbol[d];
      }
      else
      {
        rc = false;
        *sBase32++ = error_symbol;
      }
    }
  }
  *sBase32 = 0; // nullptr terminate string

  return rc;
}